

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O2

void __thiscall dg::vr::ValueRelations::erasePlaceholderBucket(ValueRelations *this,Handle h)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  _Base_ptr p_Var3;
  V val;
  key_type local_40;
  BucketToVals *local_38;
  
  local_38 = &this->bucketToVals;
  local_40._M_data = h;
  iVar2 = std::
          _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
          ::find(&local_38->_M_t,&local_40);
  p_Var1 = iVar2._M_node[1]._M_left;
  for (p_Var3 = iVar2._M_node[1]._M_parent; p_Var3 != p_Var1; p_Var3 = (_Base_ptr)&p_Var3->_M_parent
      ) {
    local_40._M_data = *(Bucket **)p_Var3;
    std::
    _Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::_Select1st<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
    ::erase(&(this->valToBucket)._M_t,(key_type *)&local_40);
  }
  local_40._M_data = h;
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
  ::erase(&local_38->_M_t,&local_40);
  RelationsGraph<dg::vr::ValueRelations>::erase(&this->graph,h);
  return;
}

Assistant:

void ValueRelations::erasePlaceholderBucket(Handle h) {
    auto found = bucketToVals.find(h);
    assert(found != bucketToVals.end());
    for (V val : found->second) {
        assert(valToBucket.find(val) != valToBucket.end() &&
               valToBucket.at(val) == h);
        valToBucket.erase(val);
    }
    bucketToVals.erase(h);
    graph.erase(h);
}